

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PcacheSetSpillsize(PCache *p,int mxPage)

{
  int in_ESI;
  PCache *in_RDI;
  int res;
  int local_10;
  int local_c;
  
  if (in_ESI != 0) {
    local_c = in_ESI;
    if (in_ESI < 0) {
      local_c = (int)(((long)in_ESI * -0x400) / (long)(in_RDI->szPage + in_RDI->szExtra));
    }
    in_RDI->szSpill = local_c;
  }
  local_10 = numberOfCachePages(in_RDI);
  if (local_10 < in_RDI->szSpill) {
    local_10 = in_RDI->szSpill;
  }
  return local_10;
}

Assistant:

SQLITE_PRIVATE int sqlite3PcacheSetSpillsize(PCache *p, int mxPage){
  int res;
  assert( p->pCache!=0 );
  if( mxPage ){
    if( mxPage<0 ){
      mxPage = (int)((-1024*(i64)mxPage)/(p->szPage+p->szExtra));
    }
    p->szSpill = mxPage;
  }
  res = numberOfCachePages(p);
  if( res<p->szSpill ) res = p->szSpill; 
  return res;
}